

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O0

Type * __thiscall slang::ast::TypeParameterSymbol::getTypeAlias(TypeParameterSymbol *this)

{
  SymbolIndex index;
  Scope *this_00;
  Compilation *this_01;
  TypeAliasType *this_02;
  SyntaxNode *node;
  SyntaxNode *syntax;
  TypeAliasType *alias;
  Scope *scope;
  TypeParameterSymbol *this_local;
  
  if (this->typeAlias == (Type *)0x0) {
    this_00 = Symbol::getParentScope(&this->super_Symbol);
    if (this_00 == (Scope *)0x0) {
      assert::assertFailed
                ("scope",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/ParameterSymbols.cpp"
                 ,0xbb,"const Type &slang::ast::TypeParameterSymbol::getTypeAlias() const");
    }
    this_01 = Scope::getCompilation(this_00);
    this_02 = BumpAllocator::
              emplace<slang::ast::TypeAliasType,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&>
                        (&this_01->super_BumpAllocator,&(this->super_Symbol).name,
                         &(this->super_Symbol).location);
    node = Symbol::getSyntax(&this->super_Symbol);
    if (node != (SyntaxNode *)0x0) {
      Symbol::setSyntax((Symbol *)this_02,node);
    }
    DeclaredType::setLink(&this_02->targetType,&this->targetType);
    index = Symbol::getIndex(&this->super_Symbol);
    Symbol::setParent((Symbol *)this_02,this_00,index);
    this->typeAlias = &this_02->super_Type;
    this_local = (TypeParameterSymbol *)this->typeAlias;
  }
  else {
    this_local = (TypeParameterSymbol *)this->typeAlias;
  }
  return (Type *)this_local;
}

Assistant:

const Type& TypeParameterSymbol::getTypeAlias() const {
    if (typeAlias)
        return *typeAlias;

    auto scope = getParentScope();
    ASSERT(scope);

    auto alias = scope->getCompilation().emplace<TypeAliasType>(name, location);
    if (auto syntax = getSyntax())
        alias->setSyntax(*syntax);

    alias->targetType.setLink(targetType);
    alias->setParent(*scope, getIndex());

    typeAlias = alias;
    return *typeAlias;
}